

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spe-impl.inc.c
# Opt level: O0

void gen_op_evsrws(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i32 arg1,TCGv_i32 arg2)

{
  TCGLabel *l;
  TCGLabel *l_00;
  TCGv_i32 ret_00;
  TCGv_i32 t0;
  TCGLabel *l2;
  TCGLabel *l1;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGv_i32 ret_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  l = gen_new_label_ppc64(tcg_ctx);
  l_00 = gen_new_label_ppc64(tcg_ctx);
  ret_00 = tcg_temp_local_new_i32(tcg_ctx);
  tcg_gen_andi_i32_ppc64(tcg_ctx,ret_00,arg2,0x3f);
  tcg_gen_brcondi_i32_ppc64(tcg_ctx,TCG_COND_GE,ret_00,0x20,l);
  tcg_gen_sar_i32(tcg_ctx,ret,arg1,ret_00);
  tcg_gen_br(tcg_ctx,l_00);
  gen_set_label(tcg_ctx,l);
  tcg_gen_movi_i32(tcg_ctx,ret,0);
  gen_set_label(tcg_ctx,l_00);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  return;
}

Assistant:

static inline void gen_op_evsrws(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i32 arg1, TCGv_i32 arg2)
{
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGLabel *l2 = gen_new_label(tcg_ctx);
    TCGv_i32 t0 = tcg_temp_local_new_i32(tcg_ctx);

    /* No error here: 6 bits are used */
    tcg_gen_andi_i32(tcg_ctx, t0, arg2, 0x3F);
    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_GE, t0, 32, l1);
    tcg_gen_sar_i32(tcg_ctx, ret, arg1, t0);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_i32(tcg_ctx, ret, 0);
    gen_set_label(tcg_ctx, l2);
    tcg_temp_free_i32(tcg_ctx, t0);
}